

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flechette.cpp
# Opt level: O3

int AF_A_PoisonBagDamage(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  uint uVar6;
  AActor *bombspot;
  VMValue *pVVar7;
  AActor *bombsource;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  double dVar10;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005de9d2;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    bombspot = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (bombspot == (AActor *)0x0) {
LAB_005de84f:
        bombspot = (AActor *)0x0;
        pVVar7 = param;
        uVar6 = numparam;
      }
      else {
        pPVar5 = (bombspot->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(bombspot->super_DThinker).super_DObject._vptr_DObject)(bombspot);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (bombspot->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar8 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar8;
        bVar9 = pPVar5 == pPVar3;
        if (!bVar9 && !bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
        uVar6 = (uint)bVar8;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005de9d2;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_005de9c2;
          puVar2 = (undefined8 *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (puVar2 != (undefined8 *)0x0) {
              pPVar5 = (PClass *)puVar2[1];
              if (pPVar5 == (PClass *)0x0) {
                pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar6,ret);
                puVar2[1] = pPVar5;
              }
              bVar8 = pPVar5 != (PClass *)0x0;
              if (pPVar5 != pPVar3 && bVar8) {
                do {
                  pPVar5 = pPVar5->ParentClass;
                  bVar8 = pPVar5 != (PClass *)0x0;
                  if (pPVar5 == pPVar3) break;
                } while (pPVar5 != (PClass *)0x0);
              }
              if (!bVar8) {
                __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_005de9d2;
              }
            }
          }
          else if (puVar2 != (undefined8 *)0x0) goto LAB_005de9c2;
        }
        if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
           ((VVar1 != '\x03' ||
            ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))))
        {
          __assertion = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
          ;
          goto LAB_005de9d2;
        }
      }
      bombsource = (bombspot->target).field_0.p;
      if (bombsource != (AActor *)0x0) {
        if (((bombsource->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005de92e;
        (bombspot->target).field_0.p = (AActor *)0x0;
      }
      bombsource = (AActor *)0x0;
LAB_005de92e:
      local_2c.Index = (bombspot->DamageType).super_FName.Index;
      P_RadiusAttack(bombspot,bombsource,4,0x28,&local_2c,1,0);
      iVar4 = bombspot->special2;
      dVar10 = FFastTrig::sin(&fasttrig,
                              (double)iVar4 * 5.625 * 11930464.711111112 + 6755399441055744.0);
      (bombspot->__Pos).Z = dVar10 * 8.0 * 0.0625 + (bombspot->__Pos).Z;
      bombspot->special2 = iVar4 + 1U & 0x3f;
      return 0;
    }
    if (bombspot == (AActor *)0x0) goto LAB_005de84f;
  }
LAB_005de9c2:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005de9d2:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                ,0x196,"int AF_A_PoisonBagDamage(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PoisonBagDamage)
{
	PARAM_ACTION_PROLOGUE;

	int bobIndex;
	
	P_RadiusAttack (self, self->target, 4, 40, self->DamageType, RADF_HURTSOURCE);
	bobIndex = self->special2;
	self->AddZ(BobSin(bobIndex) / 16);
	self->special2 = (bobIndex + 1) & 63;
	return 0;
}